

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LennardJonesAtomTypesSectionParser.cpp
# Opt level: O1

void __thiscall
OpenMD::LennardJonesAtomTypesSectionParser::parseLine
          (LennardJonesAtomTypesSectionParser *this,ForceField *ff,string *line,int lineNo)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  AtomType *pAVar5;
  RealType RVar6;
  RealType RVar7;
  string atomTypeName;
  LennardJonesAdapter lj;
  StringTokenizer tokenizer;
  string local_c8;
  double local_a8;
  undefined1 local_a0 [32];
  StringTokenizer local_80;
  
  paVar1 = &local_c8.field_2;
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8," ;\t\n\r","");
  StringTokenizer::StringTokenizer(&local_80,line,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  iVar4 = StringTokenizer::countTokens(&local_80);
  if (iVar4 < 3) {
    snprintf(painCave.errMsg,2000,
             "LennardJonesAtomTypesSectionParser Error: Not enough tokens at line %d\n",
             (ulong)(uint)lineNo);
    painCave.isFatal = 1;
    simError();
  }
  else {
    StringTokenizer::nextToken_abi_cxx11_(&local_c8,&local_80);
    pAVar5 = ForceField::getAtomType(ff,&local_c8);
    if (pAVar5 == (AtomType *)0x0) {
      snprintf(painCave.errMsg,2000,
               "LennardJonesAtomTypesSectionParser Error: Atom Type [%s] is not created yet\n",
               local_c8._M_dataplus._M_p);
      painCave.isFatal = 1;
      simError();
    }
    else {
      RVar6 = StringTokenizer::nextTokenAsDouble(&local_80);
      RVar7 = StringTokenizer::nextTokenAsDouble(&local_80);
      dVar2 = (this->options_->EnergyUnitScaling).data_;
      local_a8 = RVar7 * (this->options_->DistanceUnitScaling).data_;
      bVar3 = StringTokenizer::hasMoreTokens(&local_80);
      if (bVar3) {
        StringTokenizer::nextToken_abi_cxx11_((string *)local_a0,&local_80);
        iVar4 = std::__cxx11::string::compare(local_a0);
        bVar3 = iVar4 == 0;
        if ((AtomType *)local_a0._0_8_ != (AtomType *)(local_a0 + 0x10)) {
          operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
        }
      }
      else {
        bVar3 = false;
      }
      local_a0._0_8_ = pAVar5;
      LennardJonesAdapter::makeLennardJones
                ((LennardJonesAdapter *)local_a0,local_a8,RVar6 * dVar2,bVar3);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.delim_._M_dataplus._M_p != &local_80.delim_.field_2) {
    operator_delete(local_80.delim_._M_dataplus._M_p,
                    local_80.delim_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.tokenString_._M_dataplus._M_p != &local_80.tokenString_.field_2) {
    operator_delete(local_80.tokenString_._M_dataplus._M_p,
                    local_80.tokenString_.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void LennardJonesAtomTypesSectionParser::parseLine(ForceField& ff,
                                                     const std::string& line,
                                                     int lineNo) {
    StringTokenizer tokenizer(line);
    int nTokens = tokenizer.countTokens();

    // in LennardJonesAtomTypesSectionParser, a line at least contains 3 tokens
    // atomTypeName, epsilon and sigma
    if (nTokens < 3) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "LennardJonesAtomTypesSectionParser Error: Not enough tokens at "
               "line %d\n",
               lineNo);
      painCave.isFatal = 1;
      simError();
    } else {
      std::string atomTypeName = tokenizer.nextToken();
      AtomType* atomType       = ff.getAtomType(atomTypeName);

      if (atomType != NULL) {
        RealType epsilon = tokenizer.nextTokenAsDouble();
        RealType sigma   = tokenizer.nextTokenAsDouble();
        bool isSoft      = false;

        epsilon *= options_.getEnergyUnitScaling();
        sigma *= options_.getDistanceUnitScaling();

        if (tokenizer.hasMoreTokens()) {
          std::string pot_type = tokenizer.nextToken();
          if (pot_type == "soft") { isSoft = true; }
        }

        LennardJonesAdapter lj = LennardJonesAdapter(atomType);
        lj.makeLennardJones(sigma, epsilon, isSoft);

      } else {
        snprintf(
            painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
            "LennardJonesAtomTypesSectionParser Error: Atom Type [%s] is not "
            "created yet\n",
            atomTypeName.c_str());
        painCave.isFatal = 1;
        simError();
      }
    }
  }